

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O0

int __thiscall glslang::TPpContext::scanToken(TPpContext *this,TPpToken *ppToken)

{
  TParseContextBase *pTVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  reference pptVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  int iVar9;
  int local_2c;
  int curToken;
  int curPos;
  int i;
  bool seenNumSign;
  TPpToken *pTStack_18;
  int token;
  TPpToken *ppToken_local;
  TPpContext *this_local;
  
  i = -1;
  pTStack_18 = ppToken;
  ppToken_local = (TPpToken *)this;
  while (bVar3 = std::
                 vector<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                 ::empty(&this->inputStack), ((bVar3 ^ 0xffU) & 1) != 0) {
    pptVar5 = std::
              vector<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
              ::back(&this->inputStack);
    i = (*(*pptVar5)->_vptr_tInput[2])(*pptVar5,pTStack_18);
    if ((i != -1) ||
       (bVar3 = std::
                vector<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                ::empty(&this->inputStack), bVar3)) break;
    popInput(this);
  }
  bVar3 = std::vector<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ::empty(&this->inputStack);
  if (!bVar3) {
    pptVar5 = std::
              vector<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
              ::back(&this->inputStack);
    uVar4 = (*(*pptVar5)->_vptr_tInput[9])();
    if (((uVar4 & 1) != 0) && ((this->inElseSkip & 1U) == 0)) {
      if (i == 10) {
        bVar3 = false;
        curToken = 0;
        while (iVar2 = curToken,
              sVar6 = std::vector<int,_std::allocator<int>_>::size(&this->lastLineTokens),
              curToken < (int)sVar6 + -1) {
          iVar9 = curToken + 1;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->lastLineTokens,(long)curToken);
          local_2c = *pvVar7;
          if ((local_2c == 0x23) &&
             (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->lastLineTokens,(long)iVar9), *pvVar7 == 0x23)) {
            local_2c = 0x97;
            iVar9 = curToken + 2;
          }
          curToken = iVar9;
          if (local_2c == 0x23) {
            if (bVar3) {
              pTVar1 = this->parseContext;
              pvVar8 = std::vector<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>::
                       operator[](&this->lastLineTokenLocs,(long)iVar2);
              (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[0x2f])
                        (pTVar1,pvVar8,
                         "(#) can be preceded in its line only by spaces or horizontal tabs","#","")
              ;
            }
            else {
              bVar3 = true;
            }
          }
        }
        std::vector<int,_std::allocator<int>_>::clear(&this->lastLineTokens);
        std::vector<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>::clear
                  (&this->lastLineTokenLocs);
      }
      else {
        std::vector<int,_std::allocator<int>_>::push_back(&this->lastLineTokens,&i);
        std::vector<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>::push_back
                  (&this->lastLineTokenLocs,&pTStack_18->loc);
      }
    }
  }
  return i;
}

Assistant:

int scanToken(TPpToken* ppToken)
    {
        int token = EndOfInput;

        while (! inputStack.empty()) {
            token = inputStack.back()->scan(ppToken);
            if (token != EndOfInput || inputStack.empty())
                break;
            popInput();
        }
        if (!inputStack.empty() && inputStack.back()->isStringInput() && !inElseSkip) {
            if (token == '\n') {
                bool seenNumSign = false;
                for (int i = 0; i < (int)lastLineTokens.size() - 1;) {
                    int curPos = i;
                    int curToken = lastLineTokens[i++];
                    if (curToken == '#' && lastLineTokens[i] == '#') {
                        curToken = PpAtomPaste;
                        i++;
                    }
                    if (curToken == '#') {
                        if (seenNumSign) {
                            parseContext.ppError(lastLineTokenLocs[curPos], "(#) can be preceded in its line only by spaces or horizontal tabs", "#", "");
                        } else {
                            seenNumSign = true;
                        }
                    }
                }
                lastLineTokens.clear();
                lastLineTokenLocs.clear();
            } else {
                lastLineTokens.push_back(token);
                lastLineTokenLocs.push_back(ppToken->loc);
            }
        }
        return token;
    }